

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# by.hpp
# Opt level: O0

tuple<int_&&,_int,_int> __thiscall
burst::by<2ul,DOCTEST_ANON_SUITE_2::DOCTEST_ANON_FUNC_5()::__1&,std::tuple<int&&,int,int&&>>
          (burst *this,anon_class_1_0_00000001_for_f *f,tuple<int_&&,_int,_int_&&> *t)

{
  tuple<int_&&,_int,_int> tVar1;
  unsigned_long size;
  tuple<int_&&,_int,_int_&&> *t_local;
  anon_class_1_0_00000001_for_f *f_local;
  
  tVar1 = detail::
          by_impl<2UL,_0UL,_1UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_test_burst_functional_only_cpp:58:27)_&,_std::tuple<int_&&,_int,_int_&&>_>
                    (this,f,t);
  tVar1.super__Tuple_impl<0UL,_int_&&,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<int_&&,_int,_int>)tVar1.super__Tuple_impl<0UL,_int_&&,_int,_int>;
}

Assistant:

constexpr decltype(auto) by (UnaryFunction && f, Tuple && t)
    {
        constexpr auto size = std::tuple_size<std::decay_t<Tuple>>::value;
        static_assert(Index < size, "Попытка преобразовать несуществующий элемент кортежа");
        return
            detail::by_impl<Index>
            (
                make_index_range<0, Index>{},
                make_index_range<Index + 1, size>{},
                std::forward<UnaryFunction>(f),
                std::forward<Tuple>(t)
            );
    }